

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O3

void __thiscall
rr::TriangleRasterizer::rasterizeMultiSample<2>
          (TriangleRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  Vec4 *pVVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  bool bVar18;
  int iVar19;
  sbyte sVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  long *plVar26;
  long lVar27;
  int iVar28;
  long *plVar29;
  long *plVar30;
  bool bVar31;
  int iVar32;
  ulong uVar33;
  ulong uVar34;
  long *plVar35;
  long *plVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  long *plVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  Vector<long,_4> e20 [2];
  Vector<long,_4> e12 [2];
  deInt64 sy [4];
  Vector<long,_4> e01 [2];
  long *local_230;
  long *local_210;
  float local_1e8 [4];
  undefined8 local_1d8;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8 [22];
  long *local_170;
  long local_158 [17];
  int *local_d0;
  FragmentPacket *local_c8;
  long local_b8 [4];
  long local_98 [10];
  int local_48;
  int iStack_44;
  Vector<float,_4> res_2;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  
  local_d0 = numPacketsRasterized;
  local_c8 = fragmentPackets;
  iVar3 = (this->m_curPos).m_data[1];
  iVar32 = (this->m_bboxMax).m_data[1];
  iVar28 = 0;
  if (0 < maxFragmentPackets && iVar3 <= iVar32) {
    fVar2 = (this->m_v2).m_data[2];
    fVar42 = (this->m_v0).m_data[2] - fVar2;
    fVar43 = (this->m_v1).m_data[2] - fVar2;
    iVar28 = 0;
    do {
      iVar4 = (this->m_curPos).m_data[0];
      iVar21 = iVar3 + 1;
      iVar25 = iVar4 + 1;
      local_98[8] = CONCAT44(-(uint)(iVar4 << 8 < 0),iVar4 << 8);
      _local_48 = CONCAT44(-(uint)(iVar25 * 0x100 < 0),iVar25 * 0x100);
      local_b8[0] = (long)(iVar3 << 8);
      local_b8[1] = (long)(iVar3 << 8);
      local_b8[2] = (long)(iVar21 * 0x100);
      local_b8[3] = (long)(iVar21 * 0x100);
      iVar19 = (this->m_viewport).m_data[2] + (this->m_viewport).m_data[0];
      iVar22 = (this->m_viewport).m_data[3] + (this->m_viewport).m_data[1];
      local_98[6] = 0;
      local_98[7] = 0;
      local_98[4] = 0;
      local_98[5] = 0;
      local_98[2] = 0;
      local_98[3] = 0;
      local_98[0] = 0;
      local_98[1] = 0;
      local_158[0xe] = 0;
      local_158[0xf] = 0;
      local_158[0xc] = 0;
      local_158[0xd] = 0;
      local_158[10] = 0;
      local_158[0xb] = 0;
      local_158[8] = 0;
      local_158[9] = 0;
      local_158[6] = 0;
      local_158[7] = 0;
      local_158[4] = 0;
      local_158[5] = 0;
      local_158[2] = 0;
      local_158[3] = 0;
      local_158[0] = 0;
      local_158[1] = 0;
      lVar5 = (this->m_edge01).a;
      lVar6 = (this->m_edge01).b;
      lVar7 = (this->m_edge01).c;
      lVar8 = (this->m_edge12).a;
      lVar9 = (this->m_edge12).b;
      lVar10 = (this->m_edge12).c;
      lVar11 = (this->m_edge20).a;
      lVar12 = (this->m_edge20).b;
      lVar13 = (this->m_edge20).c;
      plVar26 = local_158;
      plVar35 = local_158 + 8;
      plVar30 = local_98;
      lVar24 = 0;
      bVar18 = true;
      do {
        bVar31 = bVar18;
        lVar27 = (&s_samplePos2)[lVar24];
        lVar24 = (&DAT_00234f78)[lVar24];
        lVar23 = 0;
        do {
          lVar40 = local_98[lVar23 + 8] + lVar27;
          lVar38 = local_b8[lVar23] + lVar24;
          plVar30[lVar23] = lVar6 * lVar38 + lVar5 * lVar40 + lVar7;
          plVar35[lVar23] = lVar9 * lVar38 + lVar8 * lVar40 + lVar10;
          plVar26[lVar23] = lVar38 * lVar12 + lVar40 * lVar11 + lVar13;
          lVar23 = lVar23 + 1;
        } while (lVar23 != 4);
        lVar24 = 2;
        plVar26 = local_158 + 4;
        plVar35 = local_158 + 0xc;
        plVar30 = local_98 + 4;
        bVar18 = false;
      } while (bVar31);
      uVar37 = (ulong)(this->m_edge01).inclusive;
      lVar27 = -uVar37;
      uVar39 = (ulong)(this->m_edge12).inclusive;
      lVar23 = -uVar39;
      lVar24 = -(ulong)(this->m_edge20).inclusive;
      plVar26 = local_158;
      plVar35 = local_158 + 1;
      local_170 = local_158 + 2;
      local_210 = local_158 + 3;
      plVar30 = local_158 + 8;
      plVar41 = local_158 + 9;
      local_230 = local_158 + 10;
      plVar36 = local_158 + 0xb;
      plVar29 = local_98;
      sVar20 = 0;
      uVar33 = 0;
      bVar18 = true;
      do {
        bVar31 = bVar18;
        lVar38 = *plVar29;
        if ((lVar38 == lVar27 || SBORROW8(lVar38,lVar27) != (long)(lVar38 + uVar37) < 0) ||
           (lVar38 = *plVar30,
           lVar38 == lVar23 || SBORROW8(lVar38,lVar23) != (long)(lVar38 + uVar39) < 0)) {
          uVar34 = uVar33 & ~(1L << sVar20);
        }
        else {
          uVar34 = uVar33 & ~(1L << sVar20);
          if (lVar24 < *plVar26) {
            uVar34 = uVar33 | 1L << sVar20;
          }
        }
        if (((iVar25 == iVar19) ||
            (lVar38 = plVar29[1],
            lVar38 == lVar27 || SBORROW8(lVar38,lVar27) != (long)(lVar38 + uVar37) < 0)) ||
           (lVar38 = *plVar41,
           lVar38 == lVar23 || SBORROW8(lVar38,lVar23) != (long)(lVar38 + uVar39) < 0)) {
          uVar33 = uVar34 & ~(0x10L << sVar20);
        }
        else {
          uVar33 = ~(0x10L << sVar20) & uVar34;
          if (lVar24 < *plVar35) {
            uVar33 = uVar34 | 0x10L << sVar20;
          }
        }
        if (((iVar21 == iVar22) ||
            (lVar38 = plVar29[2],
            lVar38 == lVar27 || SBORROW8(lVar38,lVar27) != (long)(lVar38 + uVar37) < 0)) ||
           (lVar38 = *local_230,
           lVar38 == lVar23 || SBORROW8(lVar38,lVar23) != (long)(lVar38 + uVar39) < 0)) {
          uVar34 = uVar33 & ~(4L << sVar20);
        }
        else {
          uVar34 = ~(4L << sVar20) & uVar33;
          if (lVar24 < *local_170) {
            uVar34 = uVar33 | 4L << sVar20;
          }
        }
        if (((iVar21 == iVar22 || iVar25 == iVar19) ||
            (lVar38 = plVar29[3],
            lVar38 == lVar27 || SBORROW8(lVar38,lVar27) != (long)(lVar38 + uVar37) < 0)) ||
           (lVar38 = *plVar36,
           lVar38 == lVar23 || SBORROW8(lVar38,lVar23) != (long)(lVar38 + uVar39) < 0)) {
          uVar33 = uVar34 & ~(0x40L << sVar20);
        }
        else {
          uVar33 = ~(0x40L << sVar20) & uVar34;
          if (lVar24 < *local_210) {
            uVar33 = uVar34 | 0x40L << sVar20;
          }
        }
        sVar20 = 1;
        plVar26 = local_158 + 4;
        plVar35 = local_158 + 5;
        local_170 = local_158 + 6;
        local_210 = local_158 + 7;
        plVar30 = local_158 + 0xc;
        plVar41 = local_158 + 0xd;
        local_230 = local_158 + 0xe;
        plVar36 = local_158 + 0xf;
        plVar29 = local_98 + 4;
        bVar18 = false;
      } while (bVar31);
      (this->m_curPos).m_data[0] = iVar4 + 2;
      iVar19 = iVar3;
      if ((this->m_bboxMax).m_data[0] < iVar4 + 2) {
        iVar19 = iVar3 + 2;
        (this->m_curPos).m_data[1] = iVar19;
        (this->m_curPos).m_data[0] = (this->m_bboxMin).m_data[0];
      }
      if (uVar33 != 0) {
        if (depthValues != (float *)0x0) {
          plVar26 = local_158;
          plVar35 = local_158 + 8;
          plVar30 = local_98;
          uVar37 = 0;
          bVar18 = true;
          do {
            bVar31 = bVar18;
            local_1c8[0] = 0.0;
            local_1c8[1] = 0.0;
            local_1c8[2] = 0.0;
            local_1c8[3] = 0.0;
            lVar24 = 0;
            do {
              *(ulong *)(local_1c8 + lVar24) =
                   CONCAT44((float)plVar30[lVar24 + 1],(float)plVar30[lVar24]);
              lVar24 = lVar24 + 2;
            } while (lVar24 != 4);
            local_1d8._0_4_ = 0.0;
            local_1d8._4_4_ = 0.0;
            fStack_1d0 = 0.0;
            fStack_1cc = 0.0;
            lVar24 = 0;
            do {
              *(ulong *)((long)&local_1d8 + lVar24 * 4) =
                   CONCAT44((float)plVar35[lVar24 + 1],(float)plVar35[lVar24]);
              lVar24 = lVar24 + 2;
            } while (lVar24 != 4);
            local_1e8[0] = 0.0;
            local_1e8[1] = 0.0;
            local_1e8[2] = 0.0;
            local_1e8[3] = 0.0;
            lVar24 = 0;
            do {
              *(ulong *)(local_1e8 + lVar24) =
                   CONCAT44((float)plVar26[lVar24 + 1],(float)plVar26[lVar24]);
              lVar24 = lVar24 + 2;
            } while (lVar24 != 4);
            auVar17._4_4_ = local_1d8._4_4_;
            auVar17._0_4_ = (float)local_1d8;
            auVar17._8_4_ = fStack_1d0;
            auVar17._12_4_ = fStack_1cc;
            auVar16._4_4_ = local_1e8[1];
            auVar16._0_4_ = local_1e8[0];
            auVar16._8_4_ = local_1e8[2];
            auVar16._12_4_ = local_1e8[3];
            local_1e8[0] = local_1c8[0] + (float)local_1d8 + local_1e8[0];
            local_1e8[1] = local_1c8[1] + local_1d8._4_4_ + local_1e8[1];
            local_1e8[2] = local_1c8[2] + fStack_1d0 + local_1e8[2];
            local_1e8[3] = local_1c8[3] + fStack_1cc + local_1e8[3];
            auVar44._4_4_ = local_1e8[1];
            auVar44._0_4_ = local_1e8[0];
            auVar44._8_4_ = local_1e8[2];
            auVar44._12_4_ = local_1e8[3];
            auVar44 = divps(auVar17,auVar44);
            auVar46._4_4_ = local_1e8[1];
            auVar46._0_4_ = local_1e8[0];
            auVar46._8_4_ = local_1e8[2];
            auVar46._12_4_ = local_1e8[3];
            auVar46 = divps(auVar16,auVar46);
            uVar37 = uVar37 | (long)(iVar28 * 8);
            depthValues[uVar37] = auVar44._0_4_ * fVar42 + fVar43 * auVar46._0_4_ + fVar2;
            depthValues[uVar37 + 2] = auVar44._4_4_ * fVar42 + auVar46._4_4_ * fVar43 + fVar2;
            depthValues[uVar37 + 4] = auVar44._8_4_ * fVar42 + auVar46._8_4_ * fVar43 + fVar2;
            depthValues[uVar37 + 6] = auVar44._12_4_ * fVar42 + auVar46._12_4_ * fVar43 + fVar2;
            uVar37 = 1;
            plVar26 = local_158 + 4;
            plVar35 = local_158 + 0xc;
            plVar30 = local_98 + 4;
            bVar18 = false;
          } while (bVar31);
        }
        local_1c8[0] = 0.0;
        local_1c8[1] = 0.0;
        local_1c8[2] = 0.0;
        local_1c8[3] = 0.0;
        local_1d8._0_4_ = 0.0;
        local_1d8._4_4_ = 0.0;
        fStack_1d0 = 0.0;
        fStack_1cc = 0.0;
        local_1e8[0] = 0.0;
        local_1e8[1] = 0.0;
        local_1e8[2] = 0.0;
        local_1e8[3] = 0.0;
        lVar24 = 0;
        do {
          lVar23 = *(long *)((long)local_98 + lVar24 * 2 + 0x40) + 0x80;
          lVar27 = *(long *)((long)local_b8 + lVar24 * 2) + 0x80;
          *(float *)((long)local_1c8 + lVar24) = (float)(lVar6 * lVar27 + lVar5 * lVar23 + lVar7);
          *(float *)((long)&local_1d8 + lVar24) = (float)(lVar9 * lVar27 + lVar8 * lVar23 + lVar10);
          *(float *)((long)local_1e8 + lVar24) = (float)(lVar27 * lVar12 + lVar23 * lVar11 + lVar13)
          ;
          lVar24 = lVar24 + 4;
        } while (lVar24 != 0x10);
        fVar51 = (this->m_v0).m_data[3];
        auVar45._0_4_ = fVar51 * (float)local_1d8;
        auVar45._4_4_ = fVar51 * local_1d8._4_4_;
        auVar45._8_4_ = fVar51 * fStack_1d0;
        auVar45._12_4_ = fVar51 * fStack_1cc;
        fVar51 = (this->m_v1).m_data[3];
        auVar47._0_4_ = fVar51 * local_1e8[0];
        auVar47._4_4_ = fVar51 * local_1e8[1];
        auVar47._8_4_ = fVar51 * local_1e8[2];
        auVar47._12_4_ = fVar51 * local_1e8[3];
        fVar51 = (this->m_v2).m_data[3];
        fVar48 = auVar45._0_4_ + auVar47._0_4_ + fVar51 * local_1c8[0];
        fVar49 = auVar45._4_4_ + auVar47._4_4_ + fVar51 * local_1c8[1];
        fVar50 = auVar45._8_4_ + auVar47._8_4_ + fVar51 * local_1c8[2];
        fVar51 = auVar45._12_4_ + auVar47._12_4_ + fVar51 * local_1c8[3];
        *(ulong *)fragmentPackets[iVar28].position.m_data = CONCAT44(iVar3,iVar4);
        fragmentPackets[iVar28].coverage = uVar33;
        auVar14._4_4_ = fVar49;
        auVar14._0_4_ = fVar48;
        auVar14._8_4_ = fVar50;
        auVar14._12_4_ = fVar51;
        auVar44 = divps(auVar45,auVar14);
        *(undefined1 (*) [16])fragmentPackets[iVar28].barycentric[0].m_data = auVar44;
        auVar15._4_4_ = fVar49;
        auVar15._0_4_ = fVar48;
        auVar15._8_4_ = fVar50;
        auVar15._12_4_ = fVar51;
        auVar46 = divps(auVar47,auVar15);
        *(undefined1 (*) [16])fragmentPackets[iVar28].barycentric[1].m_data = auVar46;
        pVVar1 = fragmentPackets[iVar28].barycentric + 2;
        pVVar1->m_data[0] = (1.0 - auVar44._0_4_) - auVar46._0_4_;
        pVVar1->m_data[1] = (1.0 - auVar44._4_4_) - auVar46._4_4_;
        pVVar1->m_data[2] = (1.0 - auVar44._8_4_) - auVar46._8_4_;
        pVVar1->m_data[3] = (1.0 - auVar44._12_4_) - auVar46._12_4_;
        iVar28 = iVar28 + 1;
        iVar32 = (this->m_bboxMax).m_data[1];
        iVar19 = (this->m_curPos).m_data[1];
      }
    } while ((iVar19 <= iVar32) && (iVar3 = iVar19, iVar28 < maxFragmentPackets));
  }
  *numPacketsRasterized = iVar28;
  return;
}

Assistant:

void TriangleRasterizer::rasterizeMultiSample (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	const deInt64*	samplePos	= DE_NULL;
	const deUint64	halfPixel	= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	int				packetNdx	= 0;

	// For depth interpolation, see rasterizeSingleSample
	const float		za			= m_v0.z()-m_v2.z();
	const float		zb			= m_v1.z()-m_v2.z();
	const float		zc			= m_v2.z();

	switch (NumSamples)
	{
		case 2:		samplePos = s_samplePos2;	break;
		case 4:		samplePos = s_samplePos4;	break;
		case 8:		samplePos = s_samplePos8;	break;
		case 16:	samplePos = s_samplePos16;	break;
		default:
			DE_ASSERT(false);
	}

	while (m_curPos.y() <= m_bboxMax.y() && packetNdx < maxFragmentPackets)
	{
		const int		x0		= m_curPos.x();
		const int		y0		= m_curPos.y();

		// Base subpixel coords
		const deInt64	sx0		= toSubpixelCoord(x0);
		const deInt64	sx1		= toSubpixelCoord(x0+1);
		const deInt64	sy0		= toSubpixelCoord(y0);
		const deInt64	sy1		= toSubpixelCoord(y0+1);

		const deInt64	sx[4]	= { sx0, sx1, sx0, sx1 };
		const deInt64	sy[4]	= { sy0, sy0, sy1, sy1 };

		// Viewport test
		const bool		outX1	= x0+1 == m_viewport.x()+m_viewport.z();
		const bool		outY1	= y0+1 == m_viewport.y()+m_viewport.w();

		DE_ASSERT(x0 < m_viewport.x()+m_viewport.z());
		DE_ASSERT(y0 < m_viewport.y()+m_viewport.w());

		// Edge values
		tcu::Vector<deInt64, 4>	e01[NumSamples];
		tcu::Vector<deInt64, 4>	e12[NumSamples];
		tcu::Vector<deInt64, 4>	e20[NumSamples];

		// Coverage
		deUint64		coverage	= 0;

		// Evaluate edge values at sample positions
		for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
		{
			const deInt64 ox = samplePos[sampleNdx*2 + 0];
			const deInt64 oy = samplePos[sampleNdx*2 + 1];

			for (int fragNdx = 0; fragNdx < 4; fragNdx++)
			{
				e01[sampleNdx][fragNdx] = evaluateEdge(m_edge01, sx[fragNdx] + ox, sy[fragNdx] + oy);
				e12[sampleNdx][fragNdx] = evaluateEdge(m_edge12, sx[fragNdx] + ox, sy[fragNdx] + oy);
				e20[sampleNdx][fragNdx] = evaluateEdge(m_edge20, sx[fragNdx] + ox, sy[fragNdx] + oy);
			}
		}

		// Compute coverage mask
		for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
		{
			coverage = setCoverageValue(coverage, NumSamples, 0, 0, sampleNdx,						isInsideCCW(m_edge01, e01[sampleNdx][0]) && isInsideCCW(m_edge12, e12[sampleNdx][0]) && isInsideCCW(m_edge20, e20[sampleNdx][0]));
			coverage = setCoverageValue(coverage, NumSamples, 1, 0, sampleNdx, !outX1 &&			isInsideCCW(m_edge01, e01[sampleNdx][1]) && isInsideCCW(m_edge12, e12[sampleNdx][1]) && isInsideCCW(m_edge20, e20[sampleNdx][1]));
			coverage = setCoverageValue(coverage, NumSamples, 0, 1, sampleNdx, !outY1 &&			isInsideCCW(m_edge01, e01[sampleNdx][2]) && isInsideCCW(m_edge12, e12[sampleNdx][2]) && isInsideCCW(m_edge20, e20[sampleNdx][2]));
			coverage = setCoverageValue(coverage, NumSamples, 1, 1, sampleNdx, !outX1 && !outY1 &&	isInsideCCW(m_edge01, e01[sampleNdx][3]) && isInsideCCW(m_edge12, e12[sampleNdx][3]) && isInsideCCW(m_edge20, e20[sampleNdx][3]));
		}

		// Advance to next location
		m_curPos.x() += 2;
		if (m_curPos.x() > m_bboxMax.x())
		{
			m_curPos.y() += 2;
			m_curPos.x()  = m_bboxMin.x();
		}

		if (coverage == 0)
			continue; // Discard.

		// Compute depth values.
		if (depthValues)
		{
			for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
			{
				// Floating-point edge values at sample coordinates.
				const tcu::Vec4&	e01f	= e01[sampleNdx].asFloat();
				const tcu::Vec4&	e12f	= e12[sampleNdx].asFloat();
				const tcu::Vec4&	e20f	= e20[sampleNdx].asFloat();

				const tcu::Vec4		edgeSum	= e01f + e12f + e20f;
				const tcu::Vec4		z0		= e12f / edgeSum;
				const tcu::Vec4		z1		= e20f / edgeSum;

				depthValues[(packetNdx*4+0)*NumSamples + sampleNdx] = z0[0]*za + z1[0]*zb + zc;
				depthValues[(packetNdx*4+1)*NumSamples + sampleNdx] = z0[1]*za + z1[1]*zb + zc;
				depthValues[(packetNdx*4+2)*NumSamples + sampleNdx] = z0[2]*za + z1[2]*zb + zc;
				depthValues[(packetNdx*4+3)*NumSamples + sampleNdx] = z0[3]*za + z1[3]*zb + zc;
			}
		}

		// Compute barycentrics and write out fragment packet
		{
			FragmentPacket& packet = fragmentPackets[packetNdx];

			// Floating-point edge values at pixel center.
			tcu::Vec4			e01f;
			tcu::Vec4			e12f;
			tcu::Vec4			e20f;

			for (int i = 0; i < 4; i++)
			{
				e01f[i] = float(evaluateEdge(m_edge01, sx[i] + halfPixel, sy[i] + halfPixel));
				e12f[i] = float(evaluateEdge(m_edge12, sx[i] + halfPixel, sy[i] + halfPixel));
				e20f[i] = float(evaluateEdge(m_edge20, sx[i] + halfPixel, sy[i] + halfPixel));
			}

			// Barycentrics & scale.
			const tcu::Vec4		b0		= e12f * m_v0.w();
			const tcu::Vec4		b1		= e20f * m_v1.w();
			const tcu::Vec4		b2		= e01f * m_v2.w();
			const tcu::Vec4		bSum	= b0 + b1 + b2;

			packet.position			= tcu::IVec2(x0, y0);
			packet.coverage			= coverage;
			packet.barycentric[0]	= b0 / bSum;
			packet.barycentric[1]	= b1 / bSum;
			packet.barycentric[2]	= 1.0f - packet.barycentric[0] - packet.barycentric[1];

			packetNdx += 1;
		}
	}

	DE_ASSERT(packetNdx <= maxFragmentPackets);
	numPacketsRasterized = packetNdx;
}